

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O3

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
LinkedReadsDatastore::get_tag_reads
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          LinkedReadsDatastore *this,LinkedTag tag)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  unsigned_long *puVar4;
  ulong uVar5;
  ulong uVar6;
  iterator iVar7;
  unsigned_long uVar8;
  unsigned_long local_30;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(__return_storage_ptr__,10000);
  puVar1 = (this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = puVar1;
  uVar6 = (long)(this->read_tag).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2;
  while (puVar2 = puVar3, 0 < (long)uVar6) {
    uVar5 = uVar6 >> 1;
    uVar6 = ~uVar5 + uVar6;
    puVar3 = puVar2 + uVar5 + 1;
    if (tag <= puVar2[uVar5]) {
      puVar3 = puVar2;
      uVar6 = uVar5;
    }
  }
  if (*puVar2 == tag) {
    local_30 = (long)puVar2 - (long)puVar1 >> 1;
    do {
      uVar8 = local_30 + 2;
      local_30 = local_30 + 1;
      iVar7._M_current =
           (__return_storage_ptr__->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      puVar4 = (__return_storage_ptr__->
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      if (iVar7._M_current == puVar4) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<long>
                  (__return_storage_ptr__,iVar7,(long *)&local_30);
        iVar7._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        puVar4 = (__return_storage_ptr__->
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      }
      else {
        *iVar7._M_current = local_30;
        iVar7._M_current = iVar7._M_current + 1;
        (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
        _M_impl.super__Vector_impl_data._M_finish = iVar7._M_current;
      }
      if (iVar7._M_current == puVar4) {
        local_30 = uVar8;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<long>
                  (__return_storage_ptr__,iVar7,(long *)&local_30);
      }
      else {
        *iVar7._M_current = uVar8;
        (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
        _M_impl.super__Vector_impl_data._M_finish = iVar7._M_current + 1;
      }
      local_30 = uVar8;
    } while (*(LinkedTag *)
              ((long)(this->read_tag).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar8 * 2) == tag);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint64_t> LinkedReadsDatastore::get_tag_reads(LinkedTag tag) const {
    std::vector<uint64_t> rids;
    rids.reserve(10000);
    for (auto n=std::lower_bound(read_tag.begin(),read_tag.end(),tag)-read_tag.begin();read_tag[n]==tag;++n) {
        rids.emplace_back( n * 2 + 1);
        rids.emplace_back( n * 2 + 2);
    }
    return rids;
}